

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O1

uint128 CityHash128WithSeed(char *s,size_t len,uint128 seed)

{
  uint64 uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  long *plVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint128 uVar17;
  
  uVar5 = seed.second;
  uVar15 = seed.first;
  if (len < 0x80) {
    if ((long)len < 0x11) {
      uVar15 = (uVar15 * -0x4b6d499041670d8d >> 0x2f ^ uVar15 * -0x4b6d499041670d8d) *
               -0x4b6d499041670d8d;
      uVar1 = HashLen0to16(s,len);
      uVar2 = uVar1 + uVar5 * -0x4b6d499041670d8d;
      uVar6 = uVar2;
      if (7 < len) {
        uVar6 = *(ulong *)s;
      }
      uVar3 = uVar6 + uVar15 >> 0x2f ^ uVar6 + uVar15;
    }
    else {
      uVar6 = (*(long *)(s + (len - 8)) + 0xb492b66fbe98f273U ^ uVar15) * -0x622015f714c7d297;
      uVar6 = (uVar6 >> 0x2f ^ uVar15 ^ uVar6) * -0x622015f714c7d297;
      uVar2 = (uVar6 >> 0x2f ^ uVar6) * -0x622015f714c7d297;
      uVar6 = (uVar5 + len ^ *(long *)(s + (len - 0x10)) + uVar2) * -0x622015f714c7d297;
      uVar6 = (uVar6 >> 0x2f ^ *(long *)(s + (len - 0x10)) + uVar2 ^ uVar6) * -0x622015f714c7d297;
      uVar3 = (uVar6 >> 0x2f ^ uVar6) * -0x622015f714c7d297;
      uVar15 = uVar15 + uVar3;
      lVar13 = len + 0x10;
      do {
        uVar15 = (((ulong)(*(long *)s * -0x4b6d499041670d8d) >> 0x2f ^
                  *(long *)s * -0x4b6d499041670d8d) * -0x4b6d499041670d8d ^ uVar15) *
                 -0x4b6d499041670d8d;
        uVar5 = uVar5 ^ uVar15;
        uVar2 = (((ulong)(*(long *)((long)s + 8) * -0x4b6d499041670d8d) >> 0x2f ^
                 *(long *)((long)s + 8) * -0x4b6d499041670d8d) * -0x4b6d499041670d8d ^ uVar2) *
                -0x4b6d499041670d8d;
        uVar3 = uVar3 ^ uVar2;
        s = (char *)((long)s + 0x10);
        lVar13 = lVar13 + -0x10;
      } while (0x20 < lVar13);
    }
    uVar15 = (uVar15 ^ uVar2) * -0x622015f714c7d297;
    uVar15 = (uVar15 >> 0x2f ^ uVar2 ^ uVar15) * -0x622015f714c7d297;
    uVar6 = (uVar15 >> 0x2f ^ uVar15) * -0x622015f714c7d297;
    uVar15 = (uVar3 ^ uVar5) * -0x622015f714c7d297;
    uVar5 = (uVar15 >> 0x2f ^ uVar5 ^ uVar15) * -0x622015f714c7d297;
    uVar15 = (uVar5 >> 0x2f ^ uVar5) * -0x622015f714c7d297 ^ uVar6;
    uVar5 = uVar15;
  }
  else {
    uVar3 = ((uVar5 ^ 0xb492b66fbe98f273) << 0xf | (uVar5 ^ 0xb492b66fbe98f273) >> 0x31) *
            -0x4b6d499041670d8d + *(long *)s;
    uVar9 = len * -0x4b6d499041670d8d;
    lVar13 = (uVar3 * 0x400000 | uVar3 >> 0x2a) * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar6 = ((uVar9 + uVar5) * 0x20000000 | uVar9 + uVar5 >> 0x23) * -0x4b6d499041670d8d + uVar15;
    uVar2 = ((*(long *)(s + 0x58) + uVar15) * 0x800 | *(long *)(s + 0x58) + uVar15 >> 0x35) *
            -0x4b6d499041670d8d;
    plVar7 = (long *)(s + 0x78);
    sVar4 = len;
    do {
      uVar15 = uVar15 + uVar3 + uVar5 + plVar7[-0xe];
      uVar5 = uVar5 + lVar13 + plVar7[-9];
      uVar15 = (uVar15 * 0x8000000 | uVar15 >> 0x25) * -0x4b6d499041670d8d ^ uVar2;
      lVar8 = uVar3 + plVar7[-10] + (uVar5 * 0x400000 | uVar5 >> 0x2a) * -0x4b6d499041670d8d;
      lVar10 = ((uVar9 + uVar6) * 0x80000000 | uVar9 + uVar6 >> 0x21) * -0x4b6d499041670d8d;
      lVar13 = lVar13 * -0x4b6d499041670d8d + plVar7[-0xf];
      uVar5 = uVar6 + lVar13 + plVar7[-0xc] + uVar15;
      uVar6 = plVar7[-0xe] + plVar7[-0xd] + lVar13;
      lVar12 = uVar6 + plVar7[-0xc];
      lVar16 = (uVar6 * 0x100000 | uVar6 >> 0x2c) + lVar13 + (uVar5 << 0x2b | uVar5 >> 0x15);
      lVar13 = uVar2 + lVar10 + plVar7[-0xb];
      uVar2 = plVar7[-0xd] + lVar8 + lVar13 + plVar7[-8];
      uVar5 = plVar7[-10] + plVar7[-9] + lVar13;
      lVar11 = uVar5 + plVar7[-8];
      uVar6 = lVar10 + lVar12 + plVar7[-6] + lVar8;
      uVar14 = (uVar5 * 0x100000 | uVar5 >> 0x2c) + lVar13 + (uVar2 << 0x2b | uVar2 >> 0x15);
      uVar5 = lVar8 + plVar7[-1] + lVar16;
      uVar9 = (uVar6 * 0x8000000 | uVar6 >> 0x25) * -0x4b6d499041670d8d ^ uVar14;
      uVar5 = lVar12 + plVar7[-2] + (uVar5 * 0x400000 | uVar5 >> 0x2a) * -0x4b6d499041670d8d;
      uVar15 = uVar15 + lVar11;
      lVar13 = lVar16 * -0x4b6d499041670d8d + plVar7[-7];
      uVar6 = plVar7[-6] + plVar7[-5] + lVar13;
      uVar3 = uVar6 + plVar7[-4];
      uVar2 = lVar11 + uVar9 + plVar7[-4] + lVar13;
      uVar15 = (uVar15 * 0x80000000 | uVar15 >> 0x21) * -0x4b6d499041670d8d;
      lVar13 = (uVar6 * 0x100000 | uVar6 >> 0x2c) + lVar13 + (uVar2 << 0x2b | uVar2 >> 0x15);
      lVar8 = uVar14 + uVar15 + plVar7[-3];
      uVar2 = plVar7[-2] + plVar7[-1] + lVar8;
      uVar6 = uVar2 + *plVar7;
      uVar14 = plVar7[-5] + uVar5 + *plVar7 + lVar8;
      uVar2 = (uVar2 * 0x100000 | uVar2 >> 0x2c) + lVar8 + (uVar14 << 0x2b | uVar14 >> 0x15);
      sVar4 = sVar4 - 0x80;
      plVar7 = plVar7 + 0x10;
    } while (0x7f < sVar4);
    uVar15 = ((uVar3 + uVar9) * 0x8000 | uVar3 + uVar9 >> 0x31) * -0x3c5a37a36834ced9 + uVar15;
    lVar10 = (uVar2 * 0x8000000 | uVar2 >> 0x25) + uVar5 * -0x3c5a37a36834ced9;
    uVar5 = uVar6 * 9;
    lVar8 = (uVar6 << 0x25 | uVar6 >> 0x1b) + uVar9 * -0x3c5a37a36834ced9;
    uVar3 = uVar3 * -0x3c5a37a36834ced9;
    if (sVar4 != 0) {
      plVar7 = (long *)(s + (len - 8));
      uVar6 = 0;
      do {
        lVar10 = ((lVar10 + uVar15) * 0x400000 | lVar10 + uVar15 >> 0x2a) * -0x3c5a37a36834ced9 +
                 lVar13;
        uVar5 = uVar5 + plVar7[-1];
        lVar8 = lVar8 + uVar2 + plVar7[-3];
        uVar2 = uVar2 + uVar3;
        lVar11 = plVar7[-3] + uVar3 + lVar8;
        uVar9 = plVar7[-1] + plVar7[-2] + lVar11;
        uVar6 = uVar6 + 0x20;
        uVar3 = lVar13 + *plVar7 + lVar11;
        uVar15 = uVar15 * -0x3c5a37a36834ced9 + uVar5;
        lVar13 = (uVar9 * 0x100000 | uVar9 >> 0x2c) + lVar11 + (uVar3 << 0x2b | uVar3 >> 0x15);
        uVar3 = (uVar9 + *plVar7) * -0x3c5a37a36834ced9;
        plVar7 = plVar7 + -4;
      } while (uVar6 < sVar4);
    }
    uVar15 = (uVar15 ^ uVar3) * -0x622015f714c7d297;
    uVar15 = (uVar15 >> 0x2f ^ uVar3 ^ uVar15) * -0x622015f714c7d297;
    lVar11 = (uVar15 >> 0x2f ^ uVar15) * -0x622015f714c7d297;
    uVar15 = (lVar8 + lVar10 ^ uVar5) * -0x622015f714c7d297;
    uVar5 = (uVar15 >> 0x2f ^ uVar5 ^ uVar15) * -0x622015f714c7d297;
    uVar5 = uVar5 >> 0x2f ^ uVar5;
    uVar15 = (lVar11 + lVar13 ^ uVar2) * -0x622015f714c7d297;
    uVar15 = (uVar15 >> 0x2f ^ uVar2 ^ uVar15) * -0x622015f714c7d297;
    uVar15 = ((uVar15 >> 0x2f ^ uVar15) + uVar5) * -0x622015f714c7d297;
    uVar6 = uVar5 * -0x622015f714c7d297 + lVar13;
    uVar5 = lVar11 + uVar2 ^ uVar6;
  }
  uVar5 = (uVar5 * -0x622015f714c7d297 >> 0x2f ^ uVar6 ^ uVar5 * -0x622015f714c7d297) *
          -0x622015f714c7d297;
  uVar17.second = (uVar5 >> 0x2f ^ uVar5) * -0x622015f714c7d297;
  uVar17.first = uVar15;
  return uVar17;
}

Assistant:

uint128 CityHash128WithSeed(const char *s, size_t len, uint128 seed) {
  if (len < 128) {
    return CityMurmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  pair<uint64, uint64> v, w;
  uint64 x = Uint128Low64(seed);
  uint64 y = Uint128High64(seed);
  uint64 z = len * k1;
  v.first = Rotate(y ^ k1, 49) * k1 + Fetch64(s);
  v.second = Rotate(v.first, 42) * k1 + Fetch64(s + 8);
  w.first = Rotate(y + z, 35) * k1 + x;
  w.second = Rotate(x + Fetch64(s + 88), 53) * k1;

  // This is the same inner loop as CityHash64(), manually unrolled.
  do {
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    len -= 128;
  } while (LIKELY(len >= 128));
  x += Rotate(v.first + z, 49) * k0;
  y = y * k0 + Rotate(w.second, 37);
  z = z * k0 + Rotate(w.first, 27);
  w.first *= 9;
  v.first *= k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (size_t tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = Rotate(x + y, 42) * k0 + v.second;
    w.first += Fetch64(s + len - tail_done + 16);
    x = x * k0 + w.first;
    z += w.second + Fetch64(s + len - tail_done);
    w.second += v.first;
    v = WeakHashLen32WithSeeds(s + len - tail_done, v.first + z, v.second);
    v.first *= k0;
  }
  // At this point our 56 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 56-byte-to-8-byte hashes to get a 16-byte final result.
  x = HashLen16(x, v.first);
  y = HashLen16(y + z, w.first);
  return uint128(HashLen16(x + v.second, w.second) + y,
                 HashLen16(x + w.second, y + v.second));
}